

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O0

void __thiscall TPZCompElDisc::TPZCompElDisc(TPZCompElDisc *this)

{
  TPZRegisterClassId *in_RDI;
  void **in_stack_ffffffffffffffb8;
  pointer_____offset_0x60___ *this_00;
  TPZAutoPointer<TPZIntPoints> *this_01;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<double,_3> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElDisc>(in_RDI,0x21);
  this_00 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02506c68);
  TPZInterpolationSpace::TPZInterpolationSpace
            ((TPZInterpolationSpace *)this_00,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZCompElDisc_025068d0;
  *(undefined ***)in_RDI = &PTR__TPZCompElDisc_025068d0;
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer((TPZAutoPointer<TPZIntPoints> *)this_00);
  *(undefined8 *)(in_RDI + 0x40) = 0xffffffffffffffff;
  TPZAutoPointer<TPZFunction<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFunction<double>_> *)this_00);
  this_01 = (TPZAutoPointer<TPZIntPoints> *)0x0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(double *)0x0);
  *(undefined4 *)(in_RDI + 0x38) = 0;
  TPZAutoPointer<TPZIntPoints>::operator=(this_01,(TPZIntPoints *)in_RDI);
  in_RDI[0x50] = (TPZRegisterClassId)0x1;
  *(undefined8 *)(in_RDI + 0x48) = 0x3ff0000000000000;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc() : TPZRegisterClassId(&TPZCompElDisc::ClassId),
TPZInterpolationSpace(), fConnectIndex(-1), fExternalShape(), fCenterPoint(3,0.)
{
	this->fShapefunctionType = pzshape::TPZShapeDisc::ETensorial;
	this->fIntRule = NULL;
    fUseQsiEta = true;
    fConstC = 1.;

}